

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.hpp
# Opt level: O2

void __thiscall
runtime::VirtualMachine::VirtualMachine
          (VirtualMachine *this,bool isDebug,ostream *out,istream *in,
          shared_ptr<const_bytecode::CompiledFile> *file)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_VirtualMachine = (_func_int **)&PTR__VirtualMachine_00139d60;
  (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file->super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (file->super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (file->super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->file).super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (file->super___shared_ptr<const_bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Heap::Heap(&this->heap,this);
  this->out = out;
  this->in = in;
  this->isPanicing = false;
  this->isDebug = isDebug;
  return;
}

Assistant:

explicit VirtualMachine(
    bool isDebug,
    std::ostream & out,
    std::istream & in,
    std::shared_ptr<const bytecode::CompiledFile> file
  ) noexcept
  : file{std::move(file)}
  , stackFrame{nullptr}
  , heap{this}
  , out{out}
  , in{in}
  , isPanicing{false}
  , isDebug{isDebug}
  {}